

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollercoster.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  char *c;
  ostream *this;
  int local_258;
  bool tmp;
  int i;
  bool local_241;
  string local_240 [7];
  bool up;
  string line;
  istream local_220 [8];
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220,argv[1],8);
  std::__cxx11::string::string(local_240);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    local_241 = true;
    local_258 = 0;
    while( true ) {
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= (ulong)(long)local_258) break;
      c = (char *)std::__cxx11::string::operator[]((ulong)local_240);
      bVar1 = convert(c,&local_241);
      if (bVar1) {
        local_241 = (bool)((local_241 ^ 0xffU) & 1);
      }
      local_258 = local_258 + 1;
    }
    this = std::operator<<((ostream *)&std::cout,local_240);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);

    string line;
    bool up;
    while (getline(stream, line)) {
        up = true;

        for(int i = 0; i < line.size(); i++){
            bool tmp = convert(line[i],up);
            if(tmp)
                up = !up;

        }
        std::cout << line << std::endl;
    }
    return 0;
}